

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-after-read-timeout.c
# Opt level: O0

void on_client_timeout(uv_timer_t *handle)

{
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  uv_timer_t *handle_local;
  
  if (handle != &timer) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-after-read-timeout.c"
            ,0x4b,"handle","==","&timer",handle,"==",&timer);
    abort();
  }
  if ((long)read_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-after-read-timeout.c"
            ,0x4c,"read_cb_called","==","0",(long)read_cb_called,"==",0);
    abort();
  }
  uv_read_stop(&client);
  uv_close(&client,on_close);
  uv_close(&timer,on_close);
  return;
}

Assistant:

static void on_client_timeout(uv_timer_t* handle) {
  ASSERT_PTR_EQ(handle, &timer);
  ASSERT_OK(read_cb_called);
  uv_read_stop((uv_stream_t*) &client);
  uv_close((uv_handle_t*) &client, on_close);
  uv_close((uv_handle_t*) &timer, on_close);
}